

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

string * __thiscall GGSock::Communicator::getPeerAddress_abi_cxx11_(Communicator *this)

{
  char *pcVar1;
  string *in_RDI;
  lock_guard<std::mutex> lock;
  Data *data;
  string *this_00;
  allocator local_25;
  in_addr_t local_24;
  Data *local_18;
  
  this_00 = in_RDI;
  local_18 = getData((Communicator *)0x12d584);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)this_00,(mutex_type *)in_RDI);
  local_24 = (local_18->peeraddr).sin_addr.s_addr;
  pcVar1 = inet_ntoa((in_addr)local_24);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,pcVar1,&local_25);
  std::allocator<char>::~allocator((allocator<char> *)&local_25);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12d5f2);
  return in_RDI;
}

Assistant:

TAddress Communicator::getPeerAddress() const {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutex);

        return inet_ntoa(data.peeraddr.sin_addr);
    }